

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trait.cpp
# Opt level: O1

void MeshLib::Trait::updateTraitString(string *traitString,string *traitName,string *traitValue)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long *plVar5;
  long *plVar6;
  ostream *poVar7;
  undefined8 *puVar8;
  long *plVar9;
  size_type *psVar10;
  ulong uVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  std::operator+(&local_90," ",traitName);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar6 = plVar5 + 2;
  if ((long *)*plVar5 == plVar6) {
    local_a0 = *plVar6;
    lStack_98 = plVar5[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar6;
    local_b0 = (long *)*plVar5;
  }
  local_a8 = plVar5[1];
  *plVar5 = (long)plVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  iVar2 = std::__cxx11::string::find((char *)traitString,(ulong)local_b0,0);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  pcVar1 = (traitName->_M_dataplus)._M_p;
  local_b0 = &local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + traitName->_M_string_length);
  std::__cxx11::string::append((char *)&local_b0);
  iVar3 = std::__cxx11::string::find((char *)traitString,(ulong)local_b0,0);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (iVar2 == -1 && iVar3 != 0) {
    if (traitString->_M_string_length == 0) {
      plVar5 = &local_60;
      pcVar1 = (traitName->_M_dataplus)._M_p;
      local_70 = plVar5;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar1,pcVar1 + traitName->_M_string_length);
      std::__cxx11::string::append((char *)&local_70);
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_70,(ulong)(traitValue->_M_dataplus)._M_p);
      psVar10 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_90.field_2._M_allocated_capacity = *psVar10;
        local_90.field_2._8_8_ = plVar6[3];
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar10;
        local_90._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_90._M_string_length = plVar6[1];
      *plVar6 = (long)psVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
      plVar6 = puVar8 + 2;
      if ((long *)*puVar8 == plVar6) {
        local_a0 = *plVar6;
        lStack_98 = puVar8[3];
        local_b0 = &local_a0;
      }
      else {
        local_a0 = *plVar6;
        local_b0 = (long *)*puVar8;
      }
      local_a8 = puVar8[1];
      *puVar8 = plVar6;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      std::__cxx11::string::operator=((string *)traitString,(string *)&local_b0);
      if (local_b0 != &local_a0) {
        operator_delete(local_b0);
      }
      plVar6 = local_70;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
        plVar6 = local_70;
      }
    }
    else {
      plVar5 = local_40;
      pcVar1 = (traitName->_M_dataplus)._M_p;
      local_50[0] = plVar5;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,pcVar1,pcVar1 + traitName->_M_string_length);
      std::__cxx11::string::append((char *)local_50);
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_50,(ulong)(traitValue->_M_dataplus)._M_p);
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_60 = *plVar9;
        lStack_58 = plVar6[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar9;
        local_70 = (long *)*plVar6;
      }
      local_68 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      psVar10 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_90.field_2._M_allocated_capacity = *psVar10;
        local_90.field_2._8_8_ = puVar8[3];
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar10;
        local_90._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_90._M_string_length = puVar8[1];
      *puVar8 = psVar10;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_90,(ulong)(traitString->_M_dataplus)._M_p);
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_a0 = *plVar9;
        lStack_98 = plVar6[3];
        local_b0 = &local_a0;
      }
      else {
        local_a0 = *plVar9;
        local_b0 = (long *)*plVar6;
      }
      local_a8 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::operator=((string *)traitString,(string *)&local_b0);
      if (local_b0 != &local_a0) {
        operator_delete(local_b0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      plVar6 = local_50[0];
      if (local_70 != &local_60) {
        operator_delete(local_70);
        plVar6 = local_50[0];
      }
    }
    if (plVar6 != plVar5) {
      operator_delete(plVar6);
    }
  }
  else {
    uVar11 = 0;
    if (iVar3 != 0) {
      uVar11 = (long)iVar2;
    }
    uVar4 = std::__cxx11::string::find_first_of((char *)traitString,0x115310,uVar11);
    iVar2 = std::__cxx11::string::find_first_of((char *)traitString,0x1152c4,uVar11);
    if (uVar4 == 0xffffffff || iVar2 == -1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"ERROR: Trait string missing parenthesis: ",0x29);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(traitString->_M_dataplus)._M_p,
                          traitString->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
    }
    else {
      std::__cxx11::string::replace
                ((ulong)traitString,(long)(int)(uVar4 + 1),(char *)(long)(int)(iVar2 + ~uVar4),
                 (ulong)(traitValue->_M_dataplus)._M_p);
    }
  }
  return;
}

Assistant:

void Trait::updateTraitString(std::string &traitString, std::string &traitName, std::string &traitValue)
{
	int sp, ep, sfp;
	sfp = (int)traitString.find(" "+traitName+"=(");
	sp = (int)traitString.find(traitName+"=(");
	if(sp==0 || sfp != (int)std::string::npos)
	{
		int temp;
		if( sp == 0 ) temp = sp;
		else temp = sfp;
		
		sp = (int)traitString.find_first_of("(", temp);
		ep = (int)traitString.find_first_of(")", temp);
		if(sp != (int)std::string::npos && ep != (int)std::string::npos)
		{
			// get inside of the parenthesis
			sp++;
			ep--;
			traitString.replace(sp, ep-sp+1, traitValue);
		}
		else
		{
			// string is corrupt
			std::cerr << "ERROR: Trait string missing parenthesis: " << traitString << std::endl;
			return;
		}
	}
	else
	{
		// trait not present in string
		if(traitString.length())
		{
			traitString = traitName + "=(" + traitValue + ") " + traitString;
		}
		else
		{
			traitString = traitName + "=(" + traitValue + ")";
		}

		return;
	}
}